

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

void __thiscall
wabt::interp::RefPtr<wabt::interp::Trap>::RefPtr
          (RefPtr<wabt::interp::Trap> *this,Store *store,Ref ref)

{
  Object *pOVar1;
  Trap *pTVar2;
  Index IVar3;
  DefinedFunc *this_00;
  Ref RVar4;
  size_t *in_RCX;
  RefPtr<wabt::interp::DefinedFunc> *this_01;
  long in_R8;
  Store *store_00;
  DefinedFunc *pDStack_d8;
  FuncDesc FStack_d0;
  Ref local_20;
  
  pOVar1 = (store->objects_).list_.
           super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
           _M_impl.super__Vector_impl_data._M_start[ref.index];
  if (((ulong)pOVar1 & 1) == 0) {
    this_01 = (RefPtr<wabt::interp::DefinedFunc> *)(long)(int)pOVar1->kind_;
    if (this_01 != (RefPtr<wabt::interp::DefinedFunc> *)0x2) {
      if (ref.index == 0) {
        this_01 = (RefPtr<wabt::interp::DefinedFunc> *)0x0;
      }
      interp::RefPtr((interp *)this_01);
      this_00 = (DefinedFunc *)operator_new(0x100);
      RVar4.index = *in_RCX;
      FStack_d0.type.super_ExternType.kind = *(ExternKind *)(in_R8 + 8);
      FStack_d0.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_001e0bc0;
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                (&FStack_d0.type.params,
                 (vector<wabt::Type,_std::allocator<wabt::Type>_> *)(in_R8 + 0x10));
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                (&FStack_d0.type.results,
                 (vector<wabt::Type,_std::allocator<wabt::Type>_> *)(in_R8 + 0x28));
      std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::vector
                (&FStack_d0.locals,
                 (vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_> *)
                 (in_R8 + 0x40));
      FStack_d0.code_offset = *(u32 *)(in_R8 + 0x58);
      store_00 = (Store *)(in_R8 + 0x60);
      std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::vector
                (&FStack_d0.handlers,
                 (vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> *)
                 store_00);
      DefinedFunc::DefinedFunc(this_00,store_00,RVar4,&FStack_d0);
      pDStack_d8 = this_00;
      RVar4.index = FreeList<wabt::interp::Object*>::New<wabt::interp::DefinedFunc*>
                              ((FreeList<wabt::interp::Object*> *)&store->objects_,&pDStack_d8);
      std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::~vector
                (&FStack_d0.handlers);
      if (FStack_d0.locals.
          super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(FStack_d0.locals.
                        super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)FStack_d0.locals.
                              super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)FStack_d0.locals.
                              super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      FStack_d0.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_001e0bc0;
      if (FStack_d0.type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(FStack_d0.type.results.
                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)FStack_d0.type.results.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)FStack_d0.type.results.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (FStack_d0.type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(FStack_d0.type.params.
                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)FStack_d0.type.params.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)FStack_d0.type.params.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      RefPtr<wabt::interp::DefinedFunc>::RefPtr(this_01,store,RVar4);
      (this_01->obj_->super_Func).super_Extern.super_Object.self_.index = RVar4.index;
      return;
    }
    local_20.index = ref.index;
    IVar3 = FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>(&store->roots_,&local_20);
    this->root_index_ = IVar3;
    pTVar2 = (Trap *)(store->objects_).list_.
                     super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[ref.index];
    if (((ulong)pTVar2 & 1) == 0) {
      this->obj_ = pTVar2;
      this->store_ = store;
      return;
    }
  }
  else if (ref.index == 0) {
    interp::RefPtr((interp *)0x0);
  }
  __assert_fail("IsUsed(index)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/interp/interp-inl.h"
                ,0xe6,
                "T &wabt::interp::FreeList<wabt::interp::Object *>::Get(Index) [T = wabt::interp::Object *]"
               );
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index));
  store_ = &store;
}